

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx2::forward
          (Eltwise_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  Mat *m;
  Mat *this_00;
  pointer pMVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  int iVar14;
  float fVar15;
  long lVar16;
  _func_int *p_Var17;
  int iVar18;
  int iVar19;
  Mat *this_01;
  size_t b;
  int q_3;
  float fVar20;
  ulong uVar21;
  pointer pMVar22;
  int q;
  float fVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  Mat local_e0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar19 = m->elempack;
  fVar15 = (float)m->c;
  iVar14 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar18 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var17 = this->_vptr_Eltwise_x86_avx2[-3];
    iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var17);
    if (iVar19 == 4) {
      if (iVar18 == 0) {
        local_78 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        fVar23 = 0.0;
        iVar19 = 0;
        if (0 < iVar14) {
          iVar19 = iVar14;
        }
        fVar20 = 0.0;
        if (0 < (int)fVar15) {
          fVar20 = fVar15;
        }
        while (fVar23 != fVar20) {
          Mat::channel(&local_e0,m,(int)fVar23);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,local_78,(int)fVar23);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          local_98._4_4_ = 0;
          local_98._0_4_ = fVar23;
          Mat::channel(&local_e0,this_00,(int)fVar23);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          iVar18 = iVar19;
          while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
            pfVar1 = (float *)((long)pvVar12 + lVar16);
            pfVar2 = (float *)((long)pvVar11 + lVar16);
            auVar25._0_4_ = *pfVar1 * *pfVar2;
            auVar25._4_4_ = pfVar1[1] * pfVar2[1];
            auVar25._8_4_ = pfVar1[2] * pfVar2[2];
            auVar25._12_4_ = pfVar1[3] * pfVar2[3];
            *(undefined1 (*) [16])((long)pvVar13 + lVar16) = auVar25;
            lVar16 = lVar16 + 0x10;
          }
          fVar23 = (float)((int)(float)local_98 + 1);
        }
        uVar21 = 2;
        while (pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48)) {
          local_98._0_4_ = (float)uVar21;
          local_98._4_4_ = (undefined4)(uVar21 >> 0x20);
          for (fVar23 = 0.0; fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar11 + lVar16);
              pfVar2 = (float *)((long)pvVar12 + lVar16);
              auVar26._0_4_ = *pfVar1 * *pfVar2;
              auVar26._4_4_ = pfVar1[1] * pfVar2[1];
              auVar26._8_4_ = pfVar1[2] * pfVar2[2];
              auVar26._12_4_ = pfVar1[3] * pfVar2[3];
              *(undefined1 (*) [16])((long)pvVar12 + lVar16) = auVar26;
              lVar16 = lVar16 + 0x10;
            }
          }
          uVar21 = CONCAT44(local_98._4_4_,(float)local_98) + 1;
        }
        p_Var17 = this->_vptr_Eltwise_x86_avx2[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var17);
      }
      if (iVar18 == 1) {
        local_98 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var17) == 0) {
          iVar19 = 0;
          if (0 < iVar14) {
            iVar19 = iVar14;
          }
          fVar23 = 0.0;
          fVar20 = 0.0;
          if (0 < (int)fVar15) {
            fVar23 = fVar15;
            fVar20 = 0.0;
          }
          for (; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
            Mat::channel(&local_e0,m,(int)fVar20);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,local_98,(int)fVar20);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar20);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar12 + lVar16);
              pfVar2 = (float *)((long)pvVar11 + lVar16);
              auVar28._0_4_ = *pfVar1 + *pfVar2;
              auVar28._4_4_ = pfVar1[1] + pfVar2[1];
              auVar28._8_4_ = pfVar1[2] + pfVar2[2];
              auVar28._12_4_ = pfVar1[3] + pfVar2[3];
              *(undefined1 (*) [16])((long)pvVar13 + lVar16) = auVar28;
              lVar16 = lVar16 + 0x10;
            }
          }
          uVar21 = 2;
          while (pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start,
                uVar21 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                                0x48)) {
            local_98._0_4_ = (float)uVar21;
            local_98._4_4_ = (undefined4)(uVar21 >> 0x20);
            for (fVar20 = 0.0; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
              Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar20);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar20);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar16 = 0;
              iVar18 = iVar19;
              while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
                pfVar1 = (float *)((long)pvVar11 + lVar16);
                pfVar2 = (float *)((long)pvVar12 + lVar16);
                auVar29._0_4_ = *pfVar1 + *pfVar2;
                auVar29._4_4_ = pfVar1[1] + pfVar2[1];
                auVar29._8_4_ = pfVar1[2] + pfVar2[2];
                auVar29._12_4_ = pfVar1[3] + pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar16) = auVar29;
                lVar16 = lVar16 + 0x10;
              }
            }
            uVar21 = CONCAT44(local_98._4_4_,(float)local_98) + 1;
          }
        }
        else {
          fStack_70 = **(float **)(&this->field_0xd8 + (long)p_Var17);
          local_58 = (*(float **)(&this->field_0xd8 + (long)p_Var17))[1];
          fVar23 = 0.0;
          iVar19 = 0;
          if (0 < iVar14) {
            iVar19 = iVar14;
          }
          fVar20 = 0.0;
          if (0 < (int)fVar15) {
            fVar20 = fVar15;
          }
          local_78 = (pointer)CONCAT44(fStack_70,fStack_70);
          pMVar22 = local_98;
          fStack_6c = fStack_70;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          for (; local_98 = pMVar22, fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
            Mat::channel(&local_e0,m,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar22,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            auVar9._4_4_ = fStack_54;
            auVar9._0_4_ = local_58;
            auVar9._8_4_ = fStack_50;
            auVar9._12_4_ = fStack_4c;
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar11 + lVar16);
              auVar27._0_4_ = (float)local_78 * *pfVar1;
              auVar27._4_4_ = local_78._4_4_ * pfVar1[1];
              auVar27._8_4_ = fStack_70 * pfVar1[2];
              auVar27._12_4_ = fStack_6c * pfVar1[3];
              auVar25 = vfmadd231ps_fma(auVar27,auVar9,
                                        *(undefined1 (*) [16])((long)pvVar12 + lVar16));
              *(undefined1 (*) [16])((long)pvVar13 + lVar16) = auVar25;
              lVar16 = lVar16 + 0x10;
            }
            pMVar22 = local_98;
          }
          pMVar22 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar22 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            local_98._0_4_ =
                 *(float *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86_avx2[-3]) +
                           (long)pMVar22 * 4);
            local_98._4_4_ = (float)local_98;
            uStack_90 = (float)local_98;
            uStack_8c = (float)local_98;
            local_78 = pMVar22;
            for (fVar23 = 0.0; fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar22,(int)fVar23);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar23);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              auVar7._4_4_ = local_98._4_4_;
              auVar7._0_4_ = (float)local_98;
              auVar7._8_4_ = uStack_90;
              auVar7._12_4_ = uStack_8c;
              lVar16 = 0;
              iVar18 = iVar19;
              while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
                auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar11 + lVar16),auVar7,
                                          *(undefined1 (*) [16])((long)pvVar12 + lVar16));
                *(undefined1 (*) [16])((long)pvVar12 + lVar16) = auVar25;
                lVar16 = lVar16 + 0x10;
              }
            }
            pMVar22 = (pointer)((long)&local_78->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) == 2) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar23 = 0.0;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if ((int)fVar15 < 1) {
          fVar15 = 0.0;
        }
        for (; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
          Mat::channel(&local_e0,m,(int)fVar23);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar22 + 1,(int)fVar23);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,(int)fVar23);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          iVar19 = iVar14;
          while (bVar24 = iVar19 != 0, iVar19 = iVar19 + -1, bVar24) {
            auVar25 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar16),
                                 *(undefined1 (*) [16])((long)pvVar12 + lVar16));
            *(undefined1 (*) [16])((long)pvVar13 + lVar16) = auVar25;
            lVar16 = lVar16 + 0x10;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (fVar23 = 0.0; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar19 = iVar14;
            while (bVar24 = iVar19 != 0, iVar19 = iVar19 + -1, bVar24) {
              auVar25 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar16),
                                   *(undefined1 (*) [16])((long)pvVar11 + lVar16));
              *(undefined1 (*) [16])((long)pvVar12 + lVar16) = auVar25;
              lVar16 = lVar16 + 0x10;
            }
          }
        }
      }
    }
    else if (iVar19 == 8) {
      if (iVar18 == 0) {
        local_78 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        fVar23 = 0.0;
        iVar19 = 0;
        if (0 < iVar14) {
          iVar19 = iVar14;
        }
        fVar20 = 0.0;
        if (0 < (int)fVar15) {
          fVar20 = fVar15;
        }
        while (fVar23 != fVar20) {
          in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
          Mat::channel(&local_e0,m,(int)fVar23);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,local_78,(int)fVar23);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          local_98._4_4_ = 0;
          local_98._0_4_ = fVar23;
          Mat::channel(&local_e0,this_00,(int)fVar23);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          iVar18 = iVar19;
          while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
            pfVar1 = (float *)((long)pvVar12 + lVar16);
            pfVar2 = (float *)((long)pvVar11 + lVar16);
            auVar5._4_4_ = pfVar1[1] * pfVar2[1];
            auVar5._0_4_ = *pfVar1 * *pfVar2;
            auVar5._8_4_ = pfVar1[2] * pfVar2[2];
            auVar5._12_4_ = pfVar1[3] * pfVar2[3];
            auVar5._16_4_ = pfVar1[4] * pfVar2[4];
            auVar5._20_4_ = pfVar1[5] * pfVar2[5];
            auVar5._24_4_ = pfVar1[6] * pfVar2[6];
            auVar5._28_4_ = pfVar1[7];
            in_ZMM0 = ZEXT3264(auVar5);
            *(undefined1 (*) [32])((long)pvVar13 + lVar16) = auVar5;
            lVar16 = lVar16 + 0x20;
          }
          fVar23 = (float)((int)(float)local_98 + 1);
        }
        uVar21 = 2;
        while (pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48)) {
          local_98._0_4_ = (float)uVar21;
          local_98._4_4_ = (undefined4)(uVar21 >> 0x20);
          for (fVar23 = 0.0; fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
            in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar11 + lVar16);
              pfVar2 = (float *)((long)pvVar12 + lVar16);
              auVar6._4_4_ = pfVar1[1] * pfVar2[1];
              auVar6._0_4_ = *pfVar1 * *pfVar2;
              auVar6._8_4_ = pfVar1[2] * pfVar2[2];
              auVar6._12_4_ = pfVar1[3] * pfVar2[3];
              auVar6._16_4_ = pfVar1[4] * pfVar2[4];
              auVar6._20_4_ = pfVar1[5] * pfVar2[5];
              auVar6._24_4_ = pfVar1[6] * pfVar2[6];
              auVar6._28_4_ = pfVar1[7];
              in_ZMM0 = ZEXT3264(auVar6);
              *(undefined1 (*) [32])((long)pvVar12 + lVar16) = auVar6;
              lVar16 = lVar16 + 0x20;
            }
          }
          uVar21 = CONCAT44(local_98._4_4_,(float)local_98) + 1;
        }
        p_Var17 = this->_vptr_Eltwise_x86_avx2[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var17);
      }
      if (iVar18 == 1) {
        local_98 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var17) == 0) {
          iVar19 = 0;
          if (0 < iVar14) {
            iVar19 = iVar14;
          }
          fVar23 = 0.0;
          fVar20 = 0.0;
          if (0 < (int)fVar15) {
            fVar23 = fVar15;
            fVar20 = 0.0;
          }
          for (; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
            Mat::channel(&local_e0,m,(int)fVar20);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,local_98,(int)fVar20);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar20);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar12 + lVar16);
              pfVar2 = (float *)((long)pvVar11 + lVar16);
              auVar30._0_4_ = *pfVar1 + *pfVar2;
              auVar30._4_4_ = pfVar1[1] + pfVar2[1];
              auVar30._8_4_ = pfVar1[2] + pfVar2[2];
              auVar30._12_4_ = pfVar1[3] + pfVar2[3];
              auVar30._16_4_ = pfVar1[4] + pfVar2[4];
              auVar30._20_4_ = pfVar1[5] + pfVar2[5];
              auVar30._24_4_ = pfVar1[6] + pfVar2[6];
              auVar30._28_4_ = pfVar1[7] + pfVar2[7];
              *(undefined1 (*) [32])((long)pvVar13 + lVar16) = auVar30;
              lVar16 = lVar16 + 0x20;
            }
          }
          uVar21 = 2;
          while (pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start,
                uVar21 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                                0x48)) {
            local_98._0_4_ = (float)uVar21;
            local_98._4_4_ = (undefined4)(uVar21 >> 0x20);
            for (fVar20 = 0.0; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
              Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar20);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar20);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar16 = 0;
              iVar18 = iVar19;
              while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
                pfVar1 = (float *)((long)pvVar11 + lVar16);
                pfVar2 = (float *)((long)pvVar12 + lVar16);
                auVar31._0_4_ = *pfVar1 + *pfVar2;
                auVar31._4_4_ = pfVar1[1] + pfVar2[1];
                auVar31._8_4_ = pfVar1[2] + pfVar2[2];
                auVar31._12_4_ = pfVar1[3] + pfVar2[3];
                auVar31._16_4_ = pfVar1[4] + pfVar2[4];
                auVar31._20_4_ = pfVar1[5] + pfVar2[5];
                auVar31._24_4_ = pfVar1[6] + pfVar2[6];
                auVar31._28_4_ = pfVar1[7] + pfVar2[7];
                *(undefined1 (*) [32])((long)pvVar12 + lVar16) = auVar31;
                lVar16 = lVar16 + 0x20;
              }
            }
            uVar21 = CONCAT44(local_98._4_4_,(float)local_98) + 1;
          }
        }
        else {
          fStack_70 = **(float **)(&this->field_0xd8 + (long)p_Var17);
          local_58 = (*(float **)(&this->field_0xd8 + (long)p_Var17))[1];
          fVar23 = 0.0;
          iVar19 = 0;
          if (0 < iVar14) {
            iVar19 = iVar14;
          }
          fVar20 = 0.0;
          if (0 < (int)fVar15) {
            fVar20 = fVar15;
          }
          local_78 = (pointer)CONCAT44(fStack_70,fStack_70);
          pMVar22 = local_98;
          fStack_6c = fStack_70;
          fStack_68 = fStack_70;
          fStack_64 = fStack_70;
          fStack_60 = fStack_70;
          fStack_5c = fStack_70;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          fStack_48 = local_58;
          fStack_44 = local_58;
          fStack_40 = local_58;
          fStack_3c = local_58;
          for (; local_98 = pMVar22, fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
            in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
            Mat::channel(&local_e0,m,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,pMVar22,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            auVar10._4_4_ = fStack_54;
            auVar10._0_4_ = local_58;
            auVar10._8_4_ = fStack_50;
            auVar10._12_4_ = fStack_4c;
            auVar10._16_4_ = fStack_48;
            auVar10._20_4_ = fStack_44;
            auVar10._24_4_ = fStack_40;
            auVar10._28_4_ = fStack_3c;
            lVar16 = 0;
            iVar18 = iVar19;
            while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
              pfVar1 = (float *)((long)pvVar11 + lVar16);
              auVar32._0_4_ = (float)local_78 * *pfVar1;
              auVar32._4_4_ = local_78._4_4_ * pfVar1[1];
              auVar32._8_4_ = fStack_70 * pfVar1[2];
              auVar32._12_4_ = fStack_6c * pfVar1[3];
              auVar32._16_4_ = fStack_68 * pfVar1[4];
              auVar32._20_4_ = fStack_64 * pfVar1[5];
              auVar32._28_36_ = in_ZMM0._28_36_;
              auVar32._24_4_ = fStack_60 * pfVar1[6];
              auVar25 = vfmadd231ps_fma(auVar32._0_32_,auVar10,
                                        *(undefined1 (*) [32])((long)pvVar12 + lVar16));
              in_ZMM0 = ZEXT1664(auVar25);
              *(undefined1 (*) [32])((long)pvVar13 + lVar16) = ZEXT1632(auVar25);
              lVar16 = lVar16 + 0x20;
            }
            pMVar22 = local_98;
          }
          pMVar22 = (pointer)0x2;
          while (pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar22 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar4) / 0x48)) {
            local_98._0_4_ =
                 *(float *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86_avx2[-3]) +
                           (long)pMVar22 * 4);
            local_98._4_4_ = (float)local_98;
            uStack_90 = (float)local_98;
            uStack_8c = (float)local_98;
            uStack_88 = (float)local_98;
            uStack_84 = (float)local_98;
            uStack_80 = (float)local_98;
            uStack_7c = (float)local_98;
            local_78 = pMVar22;
            for (fVar23 = 0.0; fVar23 != fVar20; fVar23 = (float)((int)fVar23 + 1)) {
              Mat::channel(&local_e0,pMVar4 + (long)pMVar22,(int)fVar23);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar23);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              auVar8._4_4_ = local_98._4_4_;
              auVar8._0_4_ = (float)local_98;
              auVar8._8_4_ = uStack_90;
              auVar8._12_4_ = uStack_8c;
              auVar8._16_4_ = uStack_88;
              auVar8._20_4_ = uStack_84;
              auVar8._24_4_ = uStack_80;
              auVar8._28_4_ = uStack_7c;
              lVar16 = 0;
              iVar18 = iVar19;
              while (bVar24 = iVar18 != 0, iVar18 = iVar18 + -1, bVar24) {
                auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar11 + lVar16),auVar8,
                                          *(undefined1 (*) [32])((long)pvVar12 + lVar16));
                *(undefined1 (*) [32])((long)pvVar12 + lVar16) = ZEXT1632(auVar25);
                lVar16 = lVar16 + 0x20;
              }
            }
            pMVar22 = (pointer)((long)&local_78->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) == 2) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar23 = 0.0;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if ((int)fVar15 < 1) {
          fVar15 = 0.0;
        }
        for (; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
          Mat::channel(&local_e0,m,(int)fVar23);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar22 + 1,(int)fVar23);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,(int)fVar23);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          iVar19 = iVar14;
          while (bVar24 = iVar19 != 0, iVar19 = iVar19 + -1, bVar24) {
            auVar5 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar11 + lVar16),
                                *(undefined1 (*) [32])((long)pvVar12 + lVar16));
            *(undefined1 (*) [32])((long)pvVar13 + lVar16) = auVar5;
            lVar16 = lVar16 + 0x20;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (fVar23 = 0.0; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            iVar19 = iVar14;
            while (bVar24 = iVar19 != 0, iVar19 = iVar19 + -1, bVar24) {
              auVar5 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar12 + lVar16),
                                  *(undefined1 (*) [32])((long)pvVar11 + lVar16));
              *(undefined1 (*) [32])((long)pvVar12 + lVar16) = auVar5;
              lVar16 = lVar16 + 0x20;
            }
          }
        }
      }
    }
    else {
      if (iVar18 == 0) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar20 = 0.0;
        fVar23 = 0.0;
        if (0 < (int)fVar15) {
          fVar23 = fVar15;
        }
        for (; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
          Mat::channel(&local_e0,m,(int)fVar20);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar22 + 1,(int)fVar20);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,(int)fVar20);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
            *(float *)((long)pvVar13 + lVar16) =
                 *(float *)((long)pvVar12 + lVar16) * *(float *)((long)pvVar11 + lVar16);
            lVar16 = lVar16 + 4;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (fVar20 = 0.0; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar20);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar20);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
              *(float *)((long)pvVar12 + lVar16) =
                   *(float *)((long)pvVar12 + lVar16) * *(float *)((long)pvVar11 + lVar16);
              lVar16 = lVar16 + 4;
            }
          }
        }
        p_Var17 = this->_vptr_Eltwise_x86_avx2[-3];
        iVar18 = *(int *)(&this->field_0xd0 + (long)p_Var17);
      }
      if (iVar18 == 1) {
        this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var17) == 0) {
          fVar20 = 0.0;
          fVar23 = 0.0;
          if (0 < (int)fVar15) {
            fVar23 = fVar15;
          }
          for (; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
            Mat::channel(&local_e0,m,(int)fVar20);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_01,(int)fVar20);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar20);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
              *(float *)((long)pvVar13 + lVar16) =
                   *(float *)((long)pvVar12 + lVar16) + *(float *)((long)pvVar11 + lVar16);
              lVar16 = lVar16 + 4;
            }
          }
          for (uVar21 = 2;
              pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48); uVar21 = uVar21 + 1) {
            for (fVar20 = 0.0; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
              Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar20);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar20);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar16 = 0;
              for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
                *(float *)((long)pvVar12 + lVar16) =
                     *(float *)((long)pvVar12 + lVar16) + *(float *)((long)pvVar11 + lVar16);
                lVar16 = lVar16 + 4;
              }
            }
          }
        }
        else {
          local_98._0_4_ = **(float **)(&this->field_0xd8 + (long)p_Var17);
          fVar20 = 0.0;
          fVar23 = 0.0;
          if (0 < (int)fVar15) {
            fVar23 = fVar15;
          }
          local_78 = (pointer)CONCAT44(local_78._4_4_,
                                       (*(float **)(&this->field_0xd8 + (long)p_Var17))[1]);
          for (; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
            Mat::channel(&local_e0,m,(int)fVar20);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_01,(int)fVar20);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar20);
            pvVar13 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
              auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98 *
                                                      *(float *)((long)pvVar11 + lVar16))),
                                        ZEXT416((uint)(float)local_78),
                                        ZEXT416(*(uint *)((long)pvVar12 + lVar16)));
              *(int *)((long)pvVar13 + lVar16) = auVar25._0_4_;
              lVar16 = lVar16 + 4;
            }
          }
          uVar21 = 2;
          while (pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start,
                uVar21 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                                0x48)) {
            local_98._0_4_ = (float)uVar21;
            local_98._4_4_ = (undefined4)(uVar21 >> 0x20);
            uVar3 = *(uint *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86_avx2[-3])
                             + uVar21 * 4);
            for (fVar20 = 0.0; fVar20 != fVar23; fVar20 = (float)((int)fVar20 + 1)) {
              Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar20);
              pvVar11 = local_e0.data;
              Mat::~Mat(&local_e0);
              Mat::channel(&local_e0,this_00,(int)fVar20);
              pvVar12 = local_e0.data;
              Mat::~Mat(&local_e0);
              lVar16 = 0;
              for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
                auVar25 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar11 + lVar16)),ZEXT416(uVar3),
                                          ZEXT416(*(uint *)((long)pvVar12 + lVar16)));
                *(int *)((long)pvVar12 + lVar16) = auVar25._0_4_;
                lVar16 = lVar16 + 4;
              }
            }
            uVar21 = CONCAT44(local_98._4_4_,(float)local_98) + 1;
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx2[-3]) == 2) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fVar23 = 0.0;
        if ((int)fVar15 < 1) {
          fVar15 = 0.0;
        }
        for (; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
          Mat::channel(&local_e0,m,(int)fVar23);
          pvVar11 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,pMVar22 + 1,(int)fVar23);
          pvVar12 = local_e0.data;
          Mat::~Mat(&local_e0);
          Mat::channel(&local_e0,this_00,(int)fVar23);
          pvVar13 = local_e0.data;
          Mat::~Mat(&local_e0);
          lVar16 = 0;
          for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
            auVar25 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar16)),
                                 ZEXT416(*(uint *)((long)pvVar11 + lVar16)));
            *(int *)((long)pvVar13 + lVar16) = auVar25._0_4_;
            lVar16 = lVar16 + 4;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (fVar23 = 0.0; fVar23 != fVar15; fVar23 = (float)((int)fVar23 + 1)) {
            Mat::channel(&local_e0,pMVar22 + uVar21,(int)fVar23);
            pvVar11 = local_e0.data;
            Mat::~Mat(&local_e0);
            Mat::channel(&local_e0,this_00,(int)fVar23);
            pvVar12 = local_e0.data;
            Mat::~Mat(&local_e0);
            lVar16 = 0;
            for (iVar19 = iVar14; 0 < iVar19; iVar19 = iVar19 + -1) {
              auVar25 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar12 + lVar16)),
                                   ZEXT416(*(uint *)((long)pvVar11 + lVar16)));
              *(int *)((long)pvVar12 + lVar16) = auVar25._0_4_;
              lVar16 = lVar16 + 4;
            }
          }
        }
      }
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int Eltwise_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}